

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_NestInFileClassEnumEdition2024_Test::TestBody
          (NameResolverTest_NestInFileClassEnumEdition2024_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Descriptor *this_00;
  char *pcVar3;
  AssertHelper local_2f0;
  Message local_2e8;
  string local_2e0;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  Message local_2a8;
  string local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_4;
  Message local_268;
  string local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_3;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_2;
  Message local_1e8;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Message local_1a8;
  string local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  string_view local_160;
  EnumDescriptor *local_150;
  EnumDescriptor *nested_in_enum_wrapper;
  EnumDescriptor *local_138;
  EnumDescriptor *unnested_enum;
  EnumDescriptor *local_120;
  EnumDescriptor *nest_in_file_enum;
  FileDescriptor *local_108;
  FileDescriptor *file;
  Options local_f0;
  undefined1 local_a0 [8];
  ClassNameResolver resolver;
  string_view local_20;
  NameResolverTest_NestInFileClassEnumEdition2024_Test *local_10;
  NameResolverTest_NestInFileClassEnumEdition2024_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&resolver.file_immutable_outer_class_names_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
             + 0x18),
             "\n      edition = \"2024\";\n      import \"third_party/java/protobuf/java_features.proto\";\n      package proto2_unittest;\n      enum NestedInFileClassEnum {\n        option features.(pb.java).nest_in_file_class = YES;\n\n        FOO_DEFAULT = 0;\n        FOO_VALUE = 1;\n      }\n\n      enum UnnestedEnum {\n        BAR_DEFAULT = 0;\n        BAR_VALUE = 1;\n      }\n\n      message EnumWrapper {\n        enum NestedInEnumWrapper {\n          BAZ_DEFAULT = 0;\n          BAZ_VALUE = 1;\n        }\n      }\n                "
            );
  NameResolverTest::BuildFileAndPopulatePool
            (&this->super_NameResolverTest,local_20,stack0xffffffffffffffd0);
  Options::Options(&local_f0);
  ClassNameResolver::ClassNameResolver((ClassNameResolver *)local_a0,&local_f0);
  Options::~Options(&local_f0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nest_in_file_enum,"foo.proto");
  pFVar2 = DescriptorPool::FindFileByName(&(this->super_NameResolverTest).pool_,_nest_in_file_enum);
  local_108 = pFVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&unnested_enum,
             "NestedInFileClassEnum");
  local_120 = FileDescriptor::FindEnumTypeByName(pFVar2,_unnested_enum);
  pFVar2 = local_108;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&nested_in_enum_wrapper,
             "UnnestedEnum");
  local_138 = FileDescriptor::FindEnumTypeByName(pFVar2,_nested_in_enum_wrapper);
  pFVar2 = local_108;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"EnumWrapper")
  ;
  this_00 = FileDescriptor::FindMessageTypeByName(pFVar2,local_160);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "NestedInEnumWrapper");
  local_150 = Descriptor::FindEnumTypeByName(this_00,stack0xfffffffffffffe90);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_1a0,(ClassNameResolver *)local_a0,local_138,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_180,"resolver.GetClassName(unnested_enum, true)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",&local_1a0,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x187,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_1e0,(ClassNameResolver *)local_a0,local_120,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[47],_nullptr>
            ((EqHelper *)local_1c0,"resolver.GetClassName(nest_in_file_enum, true)",
             "\"\" \"proto2_unittest.FooProto.NestedInFileClassEnum\"",&local_1e0,
             (char (*) [47])"proto2_unittest.FooProto.NestedInFileClassEnum");
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_220,(ClassNameResolver *)local_a0,local_150,true);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[48],_nullptr>
            ((EqHelper *)local_200,"resolver.GetClassName(nested_in_enum_wrapper, true)",
             "\"\" \"proto2_unittest.EnumWrapper.NestedInEnumWrapper\"",&local_220,
             (char (*) [48])"proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_260,(ClassNameResolver *)local_a0,local_138);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_240,"resolver.GetJavaImmutableClassName(unnested_enum)",
             "\"\" \"proto2_unittest.UnnestedEnum\"",&local_260,
             (char (*) [29])"proto2_unittest.UnnestedEnum");
  std::__cxx11::string::~string((string *)&local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,399,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_2a0,(ClassNameResolver *)local_a0,local_120);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[47],_nullptr>
            ((EqHelper *)local_280,"resolver.GetJavaImmutableClassName(nest_in_file_enum)",
             "\"\" \"proto2_unittest.FooProto$NestedInFileClassEnum\"",&local_2a0,
             (char (*) [47])"proto2_unittest.FooProto$NestedInFileClassEnum");
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x191,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_
            (&local_2e0,(ClassNameResolver *)local_a0,local_150);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[48],_nullptr>
            ((EqHelper *)local_2c0,"resolver.GetJavaImmutableClassName(nested_in_enum_wrapper)",
             "\"\" \"proto2_unittest.EnumWrapper$NestedInEnumWrapper\"",&local_2e0,
             (char (*) [48])"proto2_unittest.EnumWrapper$NestedInEnumWrapper");
  std::__cxx11::string::~string((string *)&local_2e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  ClassNameResolver::~ClassNameResolver((ClassNameResolver *)local_a0);
  return;
}

Assistant:

TEST_F(NameResolverTest, NestInFileClassEnumEdition2024) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2024";
      import "third_party/java/protobuf/java_features.proto";
      package proto2_unittest;
      enum NestedInFileClassEnum {
        option features.(pb.java).nest_in_file_class = YES;

        FOO_DEFAULT = 0;
        FOO_VALUE = 1;
      }

      enum UnnestedEnum {
        BAR_DEFAULT = 0;
        BAR_VALUE = 1;
      }

      message EnumWrapper {
        enum NestedInEnumWrapper {
          BAZ_DEFAULT = 0;
          BAZ_VALUE = 1;
        }
      }
                )schema");

  ClassNameResolver resolver;
  auto file = pool_.FindFileByName("foo.proto");
  auto nest_in_file_enum = file->FindEnumTypeByName("NestedInFileClassEnum");
  auto unnested_enum = file->FindEnumTypeByName("UnnestedEnum");
  auto nested_in_enum_wrapper = file->FindMessageTypeByName("EnumWrapper")
                                    ->FindEnumTypeByName("NestedInEnumWrapper");

  EXPECT_EQ(resolver.GetClassName(unnested_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetClassName(nest_in_file_enum,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooProto.NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetClassName(nested_in_enum_wrapper,
                                  /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper.NestedInEnumWrapper");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(unnested_enum),
            PACKAGE_PREFIX "proto2_unittest.UnnestedEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nest_in_file_enum),
            PACKAGE_PREFIX "proto2_unittest.FooProto$NestedInFileClassEnum");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(nested_in_enum_wrapper),
            PACKAGE_PREFIX "proto2_unittest.EnumWrapper$NestedInEnumWrapper");
}